

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_log10(double n)

{
  int local_20;
  int local_1c;
  int local_18;
  int exp;
  int ret;
  int neg;
  double n_local;
  
  local_1c = 0;
  if (n < 0.0) {
    local_20 = (int)-n;
  }
  else {
    local_20 = (int)n;
  }
  for (local_18 = local_20; 0 < local_18 / 10; local_18 = local_18 / 10) {
    local_1c = local_1c + 1;
  }
  if (n < 0.0) {
    local_1c = -local_1c;
  }
  return local_1c;
}

Assistant:

NK_LIB int
nk_log10(double n)
{
    int neg;
    int ret;
    int exp = 0;

    neg = (n < 0) ? 1 : 0;
    ret = (neg) ? (int)-n : (int)n;
    while ((ret / 10) > 0) {
        ret /= 10;
        exp++;
    }
    if (neg) exp = -exp;
    return exp;
}